

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<double,_ft::allocator<double>_>::listInit(list<double,_ft::allocator<double>_> *this)

{
  pointer plVar1;
  node *pnVar2;
  node *pnVar3;
  undefined1 *this_00;
  double local_60;
  listNode<double> local_58;
  double local_30;
  listNode<double> local_28;
  list<double,_ft::allocator<double>_> *local_10;
  list<double,_ft::allocator<double>_> *this_local;
  
  this_00 = &this->field_0x18;
  local_10 = this;
  plVar1 = allocator<ft::listNode<double>_>::allocate((allocator<ft::listNode<double>_> *)this_00,1)
  ;
  this->m_head = plVar1;
  plVar1 = allocator<ft::listNode<double>_>::allocate((allocator<ft::listNode<double>_> *)this_00,1)
  ;
  this->m_tail = plVar1;
  plVar1 = this->m_head;
  local_30 = 0.0;
  listNode<double>::listNode(&local_28,&local_30);
  allocator<ft::listNode<double>_>::construct
            ((allocator<ft::listNode<double>_> *)this_00,plVar1,&local_28);
  listNode<double>::~listNode(&local_28);
  plVar1 = this->m_tail;
  local_60 = 0.0;
  listNode<double>::listNode(&local_58,&local_60);
  allocator<ft::listNode<double>_>::construct
            ((allocator<ft::listNode<double>_> *)&this->field_0x18,plVar1,&local_58);
  listNode<double>::~listNode(&local_58);
  pnVar2 = tail(this);
  pnVar3 = head(this);
  pnVar3->next = pnVar2;
  pnVar2 = head(this);
  pnVar3 = tail(this);
  pnVar3->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}